

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O1

void StoreStats(VP8Encoder *enc)

{
  WebPAuxStats *pWVar1;
  uint64_t uVar2;
  ulong uVar3;
  int (*paiVar4) [4];
  int (*paiVar5) [4];
  long lVar6;
  long lVar7;
  WebPAuxStats *stats;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pWVar1 = enc->pic->stats;
  if (pWVar1 != (WebPAuxStats *)0x0) {
    paiVar4 = enc->residual_bytes;
    paiVar5 = pWVar1->residual_bytes;
    lVar6 = 0;
    do {
      pWVar1->segment_level[lVar6] = enc->dqm[lVar6].fstrength;
      pWVar1->segment_quant[lVar6] = enc->dqm[lVar6].quant;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)*paiVar5 + lVar7) = *(undefined4 *)((long)*paiVar4 + lVar7);
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      paiVar4 = (int (*) [4])(*paiVar4 + 1);
      paiVar5 = (int (*) [4])(*paiVar5 + 1);
    } while (lVar6 != 4);
    uVar2 = enc->sse[0];
    uVar3 = enc->sse_count;
    fVar8 = 99.0;
    uVar16 = (undefined4)(uVar3 >> 0x20);
    if (uVar3 != 0 && uVar2 != 0) {
      auVar14._8_4_ = uVar16;
      auVar14._0_8_ = uVar3;
      auVar14._12_4_ = 0x45300000;
      auVar15._8_4_ = (int)(uVar2 >> 0x20);
      auVar15._0_8_ = uVar2;
      auVar15._12_4_ = 0x45300000;
      dVar9 = log10((((auVar14._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 65025.0) /
                    ((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
      fVar8 = (float)(dVar9 * 10.0);
    }
    pWVar1->PSNR[0] = fVar8;
    uVar2 = enc->sse[1];
    fVar8 = 99.0;
    if (3 < uVar3 && uVar2 != 0) {
      auVar12._8_4_ = (int)(uVar2 >> 0x20);
      auVar12._0_8_ = uVar2;
      auVar12._12_4_ = 0x45300000;
      dVar9 = log10(((double)(uVar3 >> 2) * 65025.0) /
                    ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
      fVar8 = (float)(dVar9 * 10.0);
    }
    pWVar1->PSNR[1] = fVar8;
    uVar2 = enc->sse[2];
    fVar8 = 99.0;
    if (uVar2 != 0 && 3 < uVar3) {
      auVar10._8_4_ = (int)(uVar2 >> 0x20);
      auVar10._0_8_ = uVar2;
      auVar10._12_4_ = 0x45300000;
      dVar9 = log10(((double)(uVar3 >> 2) * 65025.0) /
                    ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
      fVar8 = (float)(dVar9 * 10.0);
    }
    pWVar1->PSNR[2] = fVar8;
    fVar8 = 99.0;
    if (1 < uVar3 * 3) {
      fVar8 = 99.0;
      lVar6 = enc->sse[1] + enc->sse[0] + enc->sse[2];
      if (lVar6 != 0) {
        auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar13._0_8_ = lVar6;
        auVar13._12_4_ = 0x45300000;
        dVar9 = log10(((double)(uVar3 * 3 >> 1) * 65025.0) /
                      ((auVar13._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)));
        fVar8 = (float)(dVar9 * 10.0);
      }
    }
    fVar11 = 99.0;
    pWVar1->PSNR[3] = fVar8;
    uVar2 = enc->sse[3];
    if (uVar2 != 0 && uVar3 != 0) {
      auVar17._8_4_ = uVar16;
      auVar17._0_8_ = uVar3;
      auVar17._12_4_ = 0x45300000;
      auVar18._8_4_ = (int)(uVar2 >> 0x20);
      auVar18._0_8_ = uVar2;
      auVar18._12_4_ = 0x45300000;
      dVar9 = log10((((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 65025.0) /
                    ((auVar18._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
      fVar11 = (float)(dVar9 * 10.0);
    }
    pWVar1->PSNR[4] = fVar11;
    pWVar1->coded_size = enc->coded_size;
    lVar6 = 0;
    do {
      pWVar1->block_count[lVar6] = enc->block_count[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  return;
}

Assistant:

static void StoreStats(VP8Encoder* const enc) {
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = enc->pic->stats;
  if (stats != NULL) {
    int i, s;
    for (i = 0; i < NUM_MB_SEGMENTS; ++i) {
      stats->segment_level[i] = enc->dqm[i].fstrength;
      stats->segment_quant[i] = enc->dqm[i].quant;
      for (s = 0; s <= 2; ++s) {
        stats->residual_bytes[s][i] = enc->residual_bytes[s][i];
      }
    }
    FinalizePSNR(enc);
    stats->coded_size = enc->coded_size;
    for (i = 0; i < 3; ++i) {
      stats->block_count[i] = enc->block_count[i];
    }
  }
#else  // defined(WEBP_DISABLE_STATS)
  WebPReportProgress(enc->pic, 100, &enc->percent);  // done!
#endif  // !defined(WEBP_DISABLE_STATS)
}